

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Lib::VirtualIterator<Kernel::Clause_*>_>::~Stack
          (Stack<Lib::VirtualIterator<Kernel::Clause_*>_> *this)

{
  VirtualIterator<Kernel::Clause_*> *this_00;
  
  this_00 = this->_cursor;
  while (this_00 != this->_stack) {
    this_00 = this_00 + -1;
    VirtualIterator<Kernel::Clause_*>::~VirtualIterator(this_00);
  }
  if (this_00 != (VirtualIterator<Kernel::Clause_*> *)0x0) {
    Lib::free(this->_stack);
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }